

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error __thiscall b2r::warp(b2r *this,context *ctx,token *token,opcode *op)

{
  ulong uVar1;
  int iVar2;
  token local_58;
  
  iVar2 = equal(token,".WARP");
  if (iVar2 == 0) {
    fail((token *)this,(char *)token,"expected .WARP");
  }
  else {
    context::tokenize(&local_58,ctx);
    token->column = local_58.column;
    (token->data).string._M_str = local_58.data.string._M_str;
    token->type = local_58.type;
    token->line = local_58.line;
    token->filename = local_58.filename;
    (token->data).predicate = local_58.data.predicate;
    uVar1 = op->value;
    if (((uVar1 & 0xe00000000) != 0) || (op->value = uVar1 | 0xe00000000, (uVar1 & 0xff00) != 0)) {
      __assert_fail("(value & bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                    ,0x31,"void opcode::add_bits(uint64_t)");
    }
    op->value = uVar1 + 0xe0000ff00;
    *(undefined8 *)this = 0;
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(warp)
    {
        if (!equal(token, ".WARP")) {
            return fail(token, "expected .WARP");
        }
        token = ctx.tokenize();
        op.add_bits(0xEULL << 32);
        op.add_bits(0xFFULL << 8);
        return {};
    }